

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ucnvmbcs.cpp
# Opt level: O2

void ucnv_MBCSWriteSub(UConverterFromUnicodeArgs *pArgs,int32_t offsetIndex,UErrorCode *pErrorCode)

{
  UConverter *pUVar1;
  uint uVar2;
  int iVar3;
  uint8_t *puVar4;
  uint8_t *source;
  undefined4 uStack_8;
  char buffer [4];
  
  pUVar1 = pArgs->converter;
  if (pUVar1->subChar1 != '\0') {
    if ((pUVar1->sharedData->mbcs).extIndexes == (int32_t *)0x0) {
      uVar2 = (uint)((ushort)pUVar1->invalidUCharBuffer[0] < 0x100);
    }
    else {
      uVar2 = (uint)pUVar1->useSubChar1;
    }
    if (uVar2 != 0) {
      source = &pUVar1->subChar1;
      iVar3 = 1;
      goto LAB_002b3f94;
    }
  }
  source = pUVar1->subChars;
  iVar3 = (int)pUVar1->subCharLen;
LAB_002b3f94:
  pUVar1->useSubChar1 = '\0';
  _uStack_8 = pUVar1;
  if ((pUVar1->sharedData->mbcs).outputType == '\f') {
    buffer._1_3_ = (undefined3)((ulong)pUVar1 >> 0x28);
    uStack_8 = SUB84(pUVar1,0);
    if (iVar3 == 2) {
      if (pUVar1->fromUnicodeStatus < 2) {
        pUVar1->fromUnicodeStatus = 2;
        puVar4 = (uint8_t *)(buffer + 1);
        _uStack_8 = CONCAT14(0xe,uStack_8);
      }
      else {
        puVar4 = (uint8_t *)buffer;
      }
      *puVar4 = *source;
      puVar4[1] = source[1];
      iVar3 = (int)puVar4 + 2;
    }
    else {
      if (iVar3 != 1) {
        *pErrorCode = U_ILLEGAL_ARGUMENT_ERROR;
        return;
      }
      if (pUVar1->fromUnicodeStatus == 2) {
        pUVar1->fromUnicodeStatus = 1;
        puVar4 = (uint8_t *)(buffer + 1);
        _uStack_8 = CONCAT14(0xf,uStack_8);
      }
      else {
        puVar4 = (uint8_t *)buffer;
      }
      *puVar4 = *source;
      iVar3 = (int)puVar4 + 1;
    }
    source = (uint8_t *)buffer;
    iVar3 = iVar3 - (int)source;
  }
  ucnv_cbFromUWriteBytes_63(pArgs,(char *)source,iVar3,offsetIndex,pErrorCode);
  return;
}

Assistant:

static void U_CALLCONV
ucnv_MBCSWriteSub(UConverterFromUnicodeArgs *pArgs,
              int32_t offsetIndex,
              UErrorCode *pErrorCode) {
    UConverter *cnv=pArgs->converter;
    char *p, *subchar;
    char buffer[4];
    int32_t length;

    /* first, select between subChar and subChar1 */
    if( cnv->subChar1!=0 &&
        (cnv->sharedData->mbcs.extIndexes!=NULL ?
            cnv->useSubChar1 :
            (cnv->invalidUCharBuffer[0]<=0xff))
    ) {
        /* select subChar1 if it is set (not 0) and the unmappable Unicode code point is up to U+00ff (IBM MBCS behavior) */
        subchar=(char *)&cnv->subChar1;
        length=1;
    } else {
        /* select subChar in all other cases */
        subchar=(char *)cnv->subChars;
        length=cnv->subCharLen;
    }

    /* reset the selector for the next code point */
    cnv->useSubChar1=FALSE;

    if (cnv->sharedData->mbcs.outputType == MBCS_OUTPUT_2_SISO) {
        p=buffer;

        /* fromUnicodeStatus contains prevLength */
        switch(length) {
        case 1:
            if(cnv->fromUnicodeStatus==2) {
                /* DBCS mode and SBCS sub char: change to SBCS */
                cnv->fromUnicodeStatus=1;
                *p++=UCNV_SI;
            }
            *p++=subchar[0];
            break;
        case 2:
            if(cnv->fromUnicodeStatus<=1) {
                /* SBCS mode and DBCS sub char: change to DBCS */
                cnv->fromUnicodeStatus=2;
                *p++=UCNV_SO;
            }
            *p++=subchar[0];
            *p++=subchar[1];
            break;
        default:
            *pErrorCode=U_ILLEGAL_ARGUMENT_ERROR;
            return;
        }
        subchar=buffer;
        length=(int32_t)(p-buffer);
    }

    ucnv_cbFromUWriteBytes(pArgs, subchar, length, offsetIndex, pErrorCode);
}